

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

void bt_skip_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
                 uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size)

{
  uint uVar1;
  uint32_t *puVar2;
  uint local_70;
  uint32_t local_6c;
  uint local_54;
  uint32_t delta;
  uint32_t len;
  uint8_t *pb;
  uint32_t *pair;
  uint32_t len1;
  uint32_t len0;
  uint32_t *ptr1;
  uint32_t *ptr0;
  uint32_t *son_local;
  uint32_t depth_local;
  uint32_t cur_match_local;
  uint8_t *cur_local;
  uint32_t pos_local;
  uint32_t len_limit_local;
  
  _len1 = son + (cyclic_pos << 1);
  pair._4_4_ = 0;
  pair._0_4_ = 0;
  ptr1 = son + (ulong)(cyclic_pos << 1) + 1;
  son_local._0_4_ = depth;
  son_local._4_4_ = cur_match;
  do {
    uVar1 = pos - son_local._4_4_;
    if (((uint32_t)son_local == 0) || (cyclic_size <= uVar1)) {
      *ptr1 = 0;
      *_len1 = 0;
      return;
    }
    if (cyclic_pos < uVar1) {
      local_6c = cyclic_size;
    }
    else {
      local_6c = 0;
    }
    puVar2 = son + ((cyclic_pos - uVar1) + local_6c) * 2;
    if (pair._4_4_ < (uint)pair) {
      local_70 = pair._4_4_;
    }
    else {
      local_70 = (uint)pair;
    }
    local_54 = local_70;
    if (cur[(ulong)local_70 - (ulong)uVar1] == cur[local_70]) {
      do {
        local_54 = local_54 + 1;
        if (local_54 == len_limit) break;
      } while (cur[(ulong)local_54 - (ulong)uVar1] == cur[local_54]);
      if (local_54 == len_limit) {
        *_len1 = *puVar2;
        *ptr1 = puVar2[1];
        return;
      }
    }
    if (cur[(ulong)local_54 - (ulong)uVar1] < cur[local_54]) {
      *_len1 = son_local._4_4_;
      _len1 = puVar2 + 1;
      son_local._4_4_ = *_len1;
      pair._0_4_ = local_54;
      son_local._0_4_ = (uint32_t)son_local - 1;
    }
    else {
      *ptr1 = son_local._4_4_;
      son_local._4_4_ = *puVar2;
      pair._4_4_ = local_54;
      ptr1 = puVar2;
      son_local._0_4_ = (uint32_t)son_local - 1;
    }
  } while( true );
}

Assistant:

static void
bt_skip_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		uint32_t *pair;
		const uint8_t *pb;
		uint32_t len;

		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return;
		}

		pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);
		pb = cur - delta;
		len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len == len_limit) {
				*ptr1 = pair[0];
				*ptr0 = pair[1];
				return;
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}